

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O2

Box * __thiscall
amrex::BATransformer::coarsen(Box *__return_storage_ptr__,BATransformer *this,Box *a_box)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  switch(this->m_bat_type) {
  case null:
  case indexType:
    uVar1 = *(undefined8 *)(a_box->smallend).vect;
    uVar2 = *(undefined8 *)((a_box->smallend).vect + 2);
    uVar3 = *(undefined8 *)((a_box->bigend).vect + 2);
    *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(a_box->bigend).vect;
    *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar3;
    *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar1;
    *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar2;
    break;
  case coarsenRatio:
    BATcoarsenRatio::coarsen(__return_storage_ptr__,&(this->m_op).m_coarsenRatio,a_box);
    break;
  case indexType_coarsenRatio:
    BATindexType_coarsenRatio::coarsen
              (__return_storage_ptr__,&(this->m_op).m_indexType_coarsenRatio,a_box);
    break;
  default:
    BATbndryReg::coarsen(__return_storage_ptr__,&(this->m_op).m_bndryReg,a_box);
  }
  return __return_storage_ptr__;
}

Assistant:

Box coarsen (Box const& a_box) const noexcept  {
        switch (m_bat_type)
        {
        case     BATType::null:
            return m_op.m_null.coarsen(a_box);
        case     BATType::indexType:
            return m_op.m_indexType.coarsen(a_box);
        case     BATType::coarsenRatio:
            return m_op.m_coarsenRatio.coarsen(a_box);
        case     BATType::indexType_coarsenRatio:
            return m_op.m_indexType_coarsenRatio.coarsen(a_box);
        default:
            return m_op.m_bndryReg.coarsen(a_box);
        }
    }